

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UtilityTests.cpp
# Opt level: O0

void __thiscall IndexIntervalTest_ToInt_Test::TestBody(IndexIntervalTest_ToInt_Test *this)

{
  bool bVar1;
  char *in_RDI;
  Vector3<int> *in_stack_00000018;
  Vector3<int> *in_stack_00000020;
  Vector3<int> *in_stack_00000028;
  IndexInterval<pica::Vector3<int>_> *in_stack_00000030;
  AssertionResult gtest_ar;
  int k;
  int j;
  int i;
  int idx;
  IndexInterval<pica::Vector3<int>_> interval;
  Vector3<int> *this_00;
  AssertionResult *this_01;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  uint uVar2;
  Type in_stack_ffffffffffffff6c;
  AssertHelper *in_stack_ffffffffffffff70;
  Vector3<int> *in_stack_ffffffffffffff78;
  IndexInterval<pica::Vector3<int>_> *in_stack_ffffffffffffff80;
  Vector3<int> local_78;
  int local_6c;
  Message *in_stack_ffffffffffffff98;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffa0;
  int local_54;
  int local_50;
  int local_4c;
  
  pica::IndexInterval<pica::Vector3<int>_>::IndexInterval
            (in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018);
  local_4c = *(int *)(in_RDI + 0x10);
  do {
    if (*(int *)(in_RDI + 0x1c) <= local_4c) {
      return;
    }
    for (local_50 = *(int *)(in_RDI + 0x14); local_50 < *(int *)(in_RDI + 0x20);
        local_50 = *(int *)(in_RDI + 0x2c) + local_50) {
      for (local_54 = *(int *)(in_RDI + 0x18); local_54 < *(int *)(in_RDI + 0x24);
          local_54 = *(int *)(in_RDI + 0x30) + local_54) {
        this_00 = &local_78;
        pica::Vector3<int>::Vector3(this_00,local_4c,local_50,local_54);
        local_6c = pica::IndexInterval<pica::Vector3<int>_>::toInt
                             (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
        this_01 = (AssertionResult *)&stack0xffffffffffffff98;
        testing::internal::EqHelper<false>::Compare<int,int>
                  (in_RDI,(char *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                   (int *)this_01,&this_00->x);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
        in_stack_ffffffffffffff57 = bVar1;
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_ffffffffffffff70);
          testing::AssertionResult::failure_message((AssertionResult *)0x236333);
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                     (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                     (int)((ulong)in_RDI >> 0x20),
                     (char *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)in_stack_ffffffffffffffa0.ptr_,in_stack_ffffffffffffff98);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
          testing::Message::~Message((Message *)0x23637f);
        }
        uVar2 = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x2363cf);
        if (uVar2 != 0) {
          return;
        }
        in_stack_ffffffffffffff64 = 0;
      }
    }
    local_4c = *(int *)(in_RDI + 0x28) + local_4c;
  } while( true );
}

Assistant:

TEST_F(IndexIntervalTest, ToInt)
{
    IndexInterval<Int3> interval(begin, end, step);
    int idx = 0;
    for (int i = begin.x; i < end.x; i += step.x)
    for (int j = begin.y; j < end.y; j += step.y)
    for (int k = begin.z; k < end.z; k += step.z) {
        ASSERT_EQ(idx, interval.toInt(Int3(i, j, k)));
        idx++;
    }
}